

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# anim_encode.c
# Opt level: O2

int FlushFrames(WebPAnimEncoder *enc)

{
  WebPMuxError error_code;
  size_t sVar1;
  long lVar2;
  long lVar3;
  EncodedFrame *pEVar4;
  EncodedFrame *pEVar5;
  EncodedFrame *pEVar6;
  int iVar7;
  byte bVar8;
  EncodedFrame temp;
  
  bVar8 = 0;
  sVar1 = enc->flush_count_;
  while( true ) {
    if (sVar1 == 0) {
      if ((enc->count_ == 1) && (sVar1 = enc->start_, sVar1 != 0)) {
        pEVar5 = enc->encoded_frames_;
        lVar3 = 0xd;
        pEVar4 = pEVar5;
        pEVar6 = &temp;
        for (lVar2 = lVar3; lVar2 != 0; lVar2 = lVar2 + -1) {
          *(uint8_t **)pEVar6 = (pEVar4->sub_frame_).bitstream.bytes;
          pEVar4 = (EncodedFrame *)((long)pEVar4 + (ulong)bVar8 * -0x10 + 8);
          pEVar6 = (EncodedFrame *)((long)pEVar6 + ((ulong)bVar8 * -2 + 1) * 8);
        }
        iVar7 = (int)sVar1;
        pEVar4 = pEVar5 + iVar7;
        for (lVar2 = lVar3; lVar2 != 0; lVar2 = lVar2 + -1) {
          (pEVar5->sub_frame_).bitstream.bytes = (pEVar4->sub_frame_).bitstream.bytes;
          pEVar4 = (EncodedFrame *)((long)pEVar4 + (ulong)bVar8 * -0x10 + 8);
          pEVar5 = (EncodedFrame *)((long)pEVar5 + (ulong)bVar8 * -0x10 + 8);
        }
        pEVar5 = &temp;
        pEVar4 = enc->encoded_frames_ + iVar7;
        for (; lVar3 != 0; lVar3 = lVar3 + -1) {
          (pEVar4->sub_frame_).bitstream.bytes = *(uint8_t **)pEVar5;
          pEVar5 = (EncodedFrame *)((long)pEVar5 + ((ulong)bVar8 * -2 + 1) * 8);
          pEVar4 = (EncodedFrame *)((long)pEVar4 + (ulong)bVar8 * -0x10 + 8);
        }
        FrameRelease(enc->encoded_frames_ + iVar7);
        enc->start_ = 0;
      }
      return 1;
    }
    sVar1 = enc->start_;
    pEVar5 = enc->encoded_frames_;
    pEVar4 = pEVar5 + sVar1;
    if (pEVar5[sVar1].is_key_frame_ != 0) {
      pEVar4 = (EncodedFrame *)&pEVar5[sVar1].key_frame_;
    }
    error_code = WebPMuxPushFrame(enc->mux_,&pEVar4->sub_frame_,1);
    if (error_code != WEBP_MUX_OK) break;
    if ((enc->options_).verbose != 0) {
      fprintf(_stderr,"INFO: Added frame. offset:%d,%d dispose:%d blend:%d\n",
              (ulong)(uint)(pEVar4->sub_frame_).x_offset,(ulong)(uint)(pEVar4->sub_frame_).y_offset,
              (ulong)(pEVar4->sub_frame_).dispose_method,(ulong)(pEVar4->sub_frame_).blend_method);
    }
    enc->out_frame_count_ = enc->out_frame_count_ + 1;
    FrameRelease(pEVar5 + sVar1);
    sVar1 = enc->flush_count_ - 1;
    enc->flush_count_ = sVar1;
    enc->start_ = enc->start_ + 1;
    enc->count_ = enc->count_ - 1;
    if (enc->keyframe_ != -1) {
      enc->keyframe_ = enc->keyframe_ + -1;
    }
  }
  MarkError2(enc,"ERROR adding frame. WebPMuxError",error_code);
  return 0;
}

Assistant:

static int FlushFrames(WebPAnimEncoder* const enc) {
  while (enc->flush_count_ > 0) {
    WebPMuxError err;
    EncodedFrame* const curr = GetFrame(enc, 0);
    const WebPMuxFrameInfo* const info =
        curr->is_key_frame_ ? &curr->key_frame_ : &curr->sub_frame_;
    assert(enc->mux_ != NULL);
    err = WebPMuxPushFrame(enc->mux_, info, 1);
    if (err != WEBP_MUX_OK) {
      MarkError2(enc, "ERROR adding frame. WebPMuxError", err);
      return 0;
    }
    if (enc->options_.verbose) {
      fprintf(stderr, "INFO: Added frame. offset:%d,%d dispose:%d blend:%d\n",
              info->x_offset, info->y_offset, info->dispose_method,
              info->blend_method);
    }
    ++enc->out_frame_count_;
    FrameRelease(curr);
    ++enc->start_;
    --enc->flush_count_;
    --enc->count_;
    if (enc->keyframe_ != KEYFRAME_NONE) --enc->keyframe_;
  }

  if (enc->count_ == 1 && enc->start_ != 0) {
    // Move enc->start to index 0.
    const int enc_start_tmp = (int)enc->start_;
    EncodedFrame temp = enc->encoded_frames_[0];
    enc->encoded_frames_[0] = enc->encoded_frames_[enc_start_tmp];
    enc->encoded_frames_[enc_start_tmp] = temp;
    FrameRelease(&enc->encoded_frames_[enc_start_tmp]);
    enc->start_ = 0;
  }
  return 1;
}